

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_heap.cpp
# Opt level: O2

void __thiscall ON_SubDHeap::ReturnArray(ON_SubDHeap *this,size_t capacity,ON__UINT_PTR *a)

{
  ulong uVar1;
  
  if (capacity == 0 && a != (ON__UINT_PTR *)0x0) {
    ON_SubDIncrementErrorCount();
  }
  else if (a == (ON__UINT_PTR *)0x0) {
    uVar1 = 0;
    goto LAB_0061422c;
  }
  uVar1 = a[-1];
LAB_0061422c:
  if ((uVar1 << 0x3e | uVar1 >> 2) < 5) {
    (*(code *)((long)&DAT_006cc268 + (long)(int)(&DAT_006cc268)[uVar1 >> 2]))();
    return;
  }
  ReturnOversizedElement(this,capacity,a);
  return;
}

Assistant:

void ON_SubDHeap::ReturnArray(
  size_t capacity,
  ON__UINT_PTR* a
  )
{
  if (nullptr != a && 0 == capacity)
  {
    ON_SubDIncrementErrorCount();
  }

  switch (ON_SubDHeap::ArrayCapacity(capacity,a))
  {
  case 0:
    break;
  case 4:
    m_fsp5.ReturnElement(a - 1);
    break;
  case 8:
    m_fsp9.ReturnElement(a - 1);
    break;
  case 16:
    m_fsp17.ReturnElement(a - 1);
    break;
  default:
    ReturnOversizedElement(capacity,a);
    break;
  }
  return;
}